

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternate_matcher.hpp
# Opt level: O3

bool __thiscall
boost::xpressive::detail::
alternate_matcher<boost::xpressive::detail::alternates_vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (alternate_matcher<boost::xpressive::detail::alternates_vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,
          matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *next)

{
  byte *pbVar1;
  long *plVar2;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  byte bVar4;
  bool bVar5;
  __normal_iterator<const_boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  _Var6;
  
  pbVar1 = (byte *)(state->cur_)._M_current;
  if (pbVar1 == (byte *)(state->end_)._M_current) {
    state->found_partial_match_ = true;
  }
  else {
    bVar4 = *pbVar1;
    if (this[0x18] ==
        (alternate_matcher<boost::xpressive::detail::alternates_vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
         )0x1) {
      plVar2 = *(long **)&(state->context_).traits_[0x21].
                          super_counted_base<boost::xpressive::detail::traits<char>_>;
      bVar4 = (**(code **)(*plVar2 + 0x20))(plVar2,(int)(char)bVar4);
    }
    bVar5 = std::bitset<256UL>::test((bitset<256UL> *)(this + 0x20),(ulong)bVar4);
    if (!bVar5) {
      return false;
    }
  }
  psVar3 = *(shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             **)(this + 8);
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>const*,std::vector<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,std::allocator<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>>,__gnu_cxx::__ops::_Iter_pred<boost::xpressive::detail::alt_match_pred<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>>
                    (*(undefined8 *)this,psVar3,state);
  return _Var6._M_current != psVar3;
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            if(!state.eos() && !this->can_match_(*state.cur_, traits_cast<Traits>(state)))
            {
                return false;
            }

            return detail::alt_match(this->alternates_, state, next);
        }